

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::AesGcmV1::read(AesGcmV1 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _func_int **pp_Var6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  short local_76;
  int local_74;
  string *local_70;
  string *local_68;
  bool *local_60;
  AesGcmV1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_60 = &this->supply_aad_prefix;
  local_68 = &this->aad_file_unique;
  local_70 = &this->aad_prefix;
  local_58 = this;
  do {
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_74,&local_76);
    if (local_74 == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    if (local_76 == 3) {
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_74 != 2) goto LAB_01caf4e5;
      iVar4 = (*pp_Var6[0x23])(this_00,local_60);
      bVar1 = 4;
LAB_01caf4d8:
      local_58->__isset = (_AesGcmV1__isset)((byte)local_58->__isset | bVar1);
    }
    else {
      if (local_76 == 2) {
        pp_Var6 = this_00->_vptr_TProtocol;
        if (local_74 == 0xb) {
          iVar4 = (*pp_Var6[0x2b])(this_00,local_68);
          bVar1 = 2;
          goto LAB_01caf4d8;
        }
      }
      else if (local_76 == 1) {
        pp_Var6 = this_00->_vptr_TProtocol;
        if (local_74 == 0xb) {
          iVar4 = (*pp_Var6[0x2b])(this_00,local_70);
          bVar1 = 1;
          goto LAB_01caf4d8;
        }
      }
      else {
        pp_Var6 = this_00->_vptr_TProtocol;
      }
LAB_01caf4e5:
      iVar4 = (*pp_Var6[0x2c])(this_00);
    }
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t AesGcmV1::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->aad_prefix);
          this->__isset.aad_prefix = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->aad_file_unique);
          this->__isset.aad_file_unique = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->supply_aad_prefix);
          this->__isset.supply_aad_prefix = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}